

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc:234:39)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
          *this,EnumDescriptor *descriptor)

{
  bool bVar1;
  MessageLite *pMVar2;
  long lVar3;
  long lVar4;
  ExtensionSet *pEVar5;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  LogMessage local_60;
  LogMessage local_50;
  LogMessage local_40;
  
  pEVar5 = (ExtensionSet *)(*(long *)(this + 0x30) + 0x10);
  bVar1 = ExtensionSet::Has(pEVar5,pb::test);
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0xec,"features.HasExtension(pb::test)");
    str_02._M_str = "Test features were not resolved properly";
    str_02._M_len = 0x28;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&local_40,str_02);
    if (!bVar1) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_40);
    }
  }
  pMVar2 = ExtensionSet::GetMessage
                     (pEVar5,pb::test,(MessageLite *)PTR__TestFeatures_default_instance__019cf370);
  if (((ulong)pMVar2[1]._vptr_MessageLite & 1) == 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0xee,"features.GetExtension(pb::test).has_file_feature()");
    str_03._M_str = "Test features were not resolved properly";
    str_03._M_len = 0x28;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&local_60,str_03);
  }
  else {
    pMVar2 = ExtensionSet::GetMessage
                       (pEVar5,pb::test,(MessageLite *)PTR__TestFeatures_default_instance__019cf370)
    ;
    if (((ulong)pMVar2[1]._vptr_MessageLite & 0x800) != 0) {
      if (0 < *(int *)(this + 4)) {
        lVar3 = 0x28;
        lVar4 = 0;
        do {
          pEVar5 = (ExtensionSet *)(*(long *)(*(long *)(this + 0x38) + lVar3) + 0x10);
          bVar1 = ExtensionSet::Has(pEVar5,pb::test);
          if (!bVar1) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_60,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                       ,0xec,"features.HasExtension(pb::test)");
            str._M_str = "Test features were not resolved properly";
            str._M_len = 0x28;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (&local_60,str);
            if (!bVar1) goto LAB_00c3e37b;
          }
          pMVar2 = ExtensionSet::GetMessage
                             (pEVar5,pb::test,
                              (MessageLite *)PTR__TestFeatures_default_instance__019cf370);
          if (((ulong)pMVar2[1]._vptr_MessageLite & 1) == 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_50,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                       ,0xee,"features.GetExtension(pb::test).has_file_feature()");
            str_00._M_str = "Test features were not resolved properly";
            str_00._M_len = 0x28;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (&local_50,str_00);
LAB_00c3e387:
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_50);
          }
          pMVar2 = ExtensionSet::GetMessage
                             (pEVar5,pb::test,
                              (MessageLite *)PTR__TestFeatures_default_instance__019cf370);
          if (((ulong)pMVar2[1]._vptr_MessageLite & 0x800) == 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_50,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                       ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
            str_01._M_str = "Test features were not resolved properly";
            str_01._M_len = 0x28;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (&local_50,str_01);
            goto LAB_00c3e387;
          }
          lVar4 = lVar4 + 1;
          lVar3 = lVar3 + 0x30;
        } while (lVar4 < *(int *)(this + 4));
      }
      return;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
    str_04._M_str = "Test features were not resolved properly";
    str_04._M_len = 0x28;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&local_60,str_04);
  }
LAB_00c3e37b:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_60);
}

Assistant:

void Visit(const EnumDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
    for (int i = 0; i < descriptor.value_count(); i++) {
      Visit(*descriptor.value(i), value(proto, i)...);
    }
  }